

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  MSize sz;
  uint uVar1;
  char *__s;
  
  uVar1 = sf >> 0x10 & 0xff;
  sz = uVar1 + (uVar1 == 0);
  __s = sb->w;
  if ((uint)(*(int *)&sb->e - (int)__s) < sz) {
    __s = lj_buf_more2(sb,sz);
  }
  if ((sf >> 8 & 1) != 0) {
    *__s = (char)c;
    __s = __s + 1;
  }
  if (1 < uVar1) {
    memset(__s,0x20,(ulong)(uVar1 - 1));
    __s = __s + (ulong)(uVar1 - 2) + 1;
  }
  if ((sf >> 8 & 1) == 0) {
    *__s = (char)c;
    __s = __s + 1;
  }
  sb->w = __s;
  return sb;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *w = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *w++ = (char)c;
  while (width-- > 1) *w++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *w++ = (char)c;
  sb->w = w;
  return sb;
}